

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O3

void capnp::_::anon_unknown_129::dynamicCheckTestMessage<capnp::DynamicStruct::Builder>
               (Builder reader)

{
  char cVar1;
  short sVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  ulong uVar6;
  DynamicEnum e;
  DynamicEnum e_00;
  DynamicEnum e_01;
  DynamicEnum e_02;
  short sVar7;
  int iVar8;
  BuilderFor<bool> BVar9;
  int8_t iVar10;
  uint8_t uVar11;
  int16_t iVar12;
  uint16_t uVar13;
  int32_t iVar14;
  uint32_t uVar15;
  int64_t iVar16;
  uchar *puVar17;
  uint64_t uVar18;
  long lVar19;
  size_type sVar20;
  bool bVar21;
  float fVar22;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  uint extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar23;
  double dVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  float fVar27;
  Builder BVar28;
  Reader RVar29;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StringPtr name_11;
  StringPtr name_12;
  StringPtr name_13;
  StringPtr name_14;
  StringPtr name_15;
  StringPtr name_16;
  StringPtr name_17;
  StringPtr name_18;
  StringPtr name_19;
  StringPtr name_20;
  StringPtr name_21;
  StringPtr name_22;
  StringPtr name_23;
  StringPtr name_24;
  StringPtr name_25;
  StringPtr name_26;
  StringPtr name_27;
  StringPtr name_28;
  StringPtr name_29;
  StringPtr name_30;
  StringPtr name_31;
  StringPtr name_32;
  StringPtr name_33;
  StringPtr name_34;
  StringPtr name_35;
  StringPtr name_36;
  StringPtr name_37;
  StringPtr name_38;
  StringPtr name_39;
  StringPtr name_40;
  StringPtr name_41;
  StringPtr name_42;
  StringPtr name_43;
  StringPtr name_44;
  StringPtr name_45;
  StringPtr name_46;
  StringPtr name_47;
  StringPtr name_48;
  StringPtr name_49;
  StringPtr name_50;
  StringPtr name_51;
  StringPtr name_52;
  StringPtr name_53;
  StringPtr name_54;
  StringPtr name_55;
  StringPtr name_56;
  StringPtr name_57;
  StringPtr name_58;
  StringPtr name_59;
  StringPtr name_60;
  StringPtr name_61;
  StringPtr name_62;
  StringPtr name_63;
  initializer_list<capnp::Void> expected;
  StringPtr name_64;
  initializer_list<bool> expected_00;
  StringPtr name_65;
  initializer_list<signed_char> expected_01;
  StringPtr name_66;
  initializer_list<short> expected_02;
  StringPtr name_67;
  initializer_list<int> expected_03;
  StringPtr name_68;
  initializer_list<long> expected_04;
  StringPtr name_69;
  initializer_list<unsigned_char> expected_05;
  StringPtr name_70;
  initializer_list<unsigned_short> expected_06;
  StringPtr name_71;
  initializer_list<unsigned_int> expected_07;
  StringPtr name_72;
  initializer_list<unsigned_long> expected_08;
  StringPtr name_73;
  initializer_list<float> expected_09;
  StringPtr name_74;
  initializer_list<double> expected_10;
  StringPtr name_75;
  initializer_list<capnp::Text::Reader> expected_11;
  StringPtr name_76;
  initializer_list<capnp::Data::Reader> expected_12;
  StringPtr name_77;
  StringPtr name_78;
  StringPtr name_79;
  StringPtr name_80;
  StringPtr name_81;
  StringPtr name_82;
  StringPtr name_83;
  StringPtr name_84;
  initializer_list<const_char_*> expected_13;
  StringPtr name_85;
  StringPtr name_86;
  StringPtr name_87;
  StringPtr name_88;
  StringPtr name_89;
  initializer_list<bool> expected_14;
  StringPtr name_90;
  initializer_list<signed_char> expected_15;
  StringPtr name_91;
  initializer_list<short> expected_16;
  StringPtr name_92;
  initializer_list<int> expected_17;
  StringPtr name_93;
  initializer_list<long> expected_18;
  StringPtr name_94;
  initializer_list<unsigned_char> expected_19;
  StringPtr name_95;
  initializer_list<unsigned_short> expected_20;
  StringPtr name_96;
  initializer_list<unsigned_int> expected_21;
  StringPtr name_97;
  initializer_list<unsigned_long> expected_22;
  StringPtr name_98;
  StringPtr name_99;
  StringPtr name_x00100;
  initializer_list<capnp::Text::Reader> expected_23;
  StringPtr name_x00101;
  initializer_list<capnp::Data::Reader> expected_24;
  StringPtr name_x00102;
  StringPtr name_x00103;
  StringPtr name_x00104;
  StringPtr name_x00105;
  StringPtr name_x00106;
  StringPtr name_x00107;
  StringPtr name_x00108;
  StringPtr name_x00109;
  initializer_list<const_char_*> expected_25;
  Fault f;
  BuilderFor<capnp::DynamicList> listReader_1;
  BuilderFor<capnp::DynamicStruct> subReader;
  BuilderFor<capnp::DynamicStruct> subSubReader;
  Fault local_848;
  char *pcStack_840;
  char *local_838;
  undefined8 uStack_830;
  char *local_828;
  undefined8 uStack_820;
  undefined8 in_stack_fffffffffffff7f0;
  float in_stack_fffffffffffff7f8;
  undefined4 in_stack_fffffffffffff7fc;
  anon_union_56_12_1c583c3a_for_Builder_1 local_800;
  undefined8 local_7c8;
  BuilderFor<DynamicStruct> local_7b8;
  BuilderFor<DynamicList> local_788;
  BuilderFor<Text> local_750;
  BuilderFor<DynamicStruct> local_738;
  undefined1 local_708 [16];
  Builder local_6f0;
  Builder local_6b0;
  Builder local_670;
  Builder local_630;
  Builder local_5f0;
  Builder local_5b0;
  Builder local_570;
  Builder local_530;
  Builder local_4f0;
  Builder local_4b0;
  Builder local_470;
  Builder local_430;
  Builder local_3f0;
  Builder local_3b0;
  Builder local_370;
  Builder local_330;
  Builder local_2f0;
  Builder local_2b0;
  Builder local_270;
  Builder local_230;
  Builder local_1f0;
  Builder local_1b0;
  Builder local_170;
  Builder local_130;
  Builder local_f0;
  Builder local_b0;
  Builder local_70;
  
  name.content.size_ = 10;
  name.content.ptr = "voidField";
  DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name);
  DynamicValue::Builder::AsImpl<capnp::Void,_(capnp::Kind)0>::apply((Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  name_00.content.size_ = 10;
  name_00.content.ptr = "boolField";
  DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_00);
  BVar9 = DynamicValue::Builder::AsImpl<bool,_(capnp::Kind)0>::apply((Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  if (!BVar9 && kj::_::Debug::minSeverity < 3) {
    in_stack_fffffffffffff7f8 = (float)CONCAT31((int3)((uint)in_stack_fffffffffffff7f8 >> 8),1);
    name_01.content.size_ = 10;
    name_01.content.ptr = "boolField";
    DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_01);
    local_788.schema.elementType.baseType._0_1_ =
         DynamicValue::Builder::AsImpl<bool,_(capnp::Kind)0>::apply((Builder *)&local_848);
    kj::_::Debug::log<char_const(&)[73],bool,bool>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x153,ERROR,
               "\"failed: expected \" \"(true) == (reader.get(\\\"boolField\\\").template as<bool>())\", true, reader.get(\"boolField\").template as<bool>()"
               ,(char (*) [73])
                "failed: expected (true) == (reader.get(\"boolField\").template as<bool>())",
               (bool *)&stack0xfffffffffffff7f8,(bool *)&local_788);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  name_02.content.size_ = 10;
  name_02.content.ptr = "int8Field";
  DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_02);
  iVar10 = DynamicValue::Builder::AsImpl<signed_char,_(capnp::Kind)0>::apply((Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  if ((iVar10 != -0x7b) && (kj::_::Debug::minSeverity < 3)) {
    in_stack_fffffffffffff7f8 = -NAN;
    name_03.content.size_ = 10;
    name_03.content.ptr = "int8Field";
    DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_03);
    iVar10 = DynamicValue::Builder::AsImpl<signed_char,_(capnp::Kind)0>::apply
                       ((Builder *)&local_848);
    local_788.schema.elementType.baseType._0_1_ = iVar10;
    kj::_::Debug::log<char_const(&)[75],int,signed_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x154,ERROR,
               "\"failed: expected \" \"(-123) == (reader.get(\\\"int8Field\\\").template as<int8_t>())\", -123, reader.get(\"int8Field\").template as<int8_t>()"
               ,(char (*) [75])
                "failed: expected (-123) == (reader.get(\"int8Field\").template as<int8_t>())",
               (int *)&stack0xfffffffffffff7f8,(char *)&local_788);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  name_04.content.size_ = 0xb;
  name_04.content.ptr = "int16Field";
  DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_04);
  iVar12 = DynamicValue::Builder::AsImpl<short,_(capnp::Kind)0>::apply((Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  if ((iVar12 != -0x3039) && (kj::_::Debug::minSeverity < 3)) {
    in_stack_fffffffffffff7f8 = -NAN;
    name_05.content.size_ = 0xb;
    name_05.content.ptr = "int16Field";
    DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_05);
    iVar12 = DynamicValue::Builder::AsImpl<short,_(capnp::Kind)0>::apply((Builder *)&local_848);
    local_788.schema.elementType.baseType = iVar12;
    kj::_::Debug::log<char_const(&)[79],int,short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x155,ERROR,
               "\"failed: expected \" \"(-12345) == (reader.get(\\\"int16Field\\\").template as<int16_t>())\", -12345, reader.get(\"int16Field\").template as<int16_t>()"
               ,(char (*) [79])
                "failed: expected (-12345) == (reader.get(\"int16Field\").template as<int16_t>())",
               (int *)&stack0xfffffffffffff7f8,(short *)&local_788);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  name_06.content.size_ = 0xb;
  name_06.content.ptr = "int32Field";
  DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_06);
  iVar14 = DynamicValue::Builder::AsImpl<int,_(capnp::Kind)0>::apply((Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  if ((iVar14 != -0xbc614e) && (kj::_::Debug::minSeverity < 3)) {
    in_stack_fffffffffffff7f8 = -2.6002345e+38;
    name_07.content.size_ = 0xb;
    name_07.content.ptr = "int32Field";
    DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_07);
    iVar14 = DynamicValue::Builder::AsImpl<int,_(capnp::Kind)0>::apply((Builder *)&local_848);
    local_788.schema.elementType.baseType = (short)iVar14;
    local_788.schema.elementType.listDepth = (char)((uint)iVar14 >> 0x10);
    local_788.schema.elementType.isImplicitParam = (bool)(char)((uint)iVar14 >> 0x18);
    kj::_::Debug::log<char_const(&)[82],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x156,ERROR,
               "\"failed: expected \" \"(-12345678) == (reader.get(\\\"int32Field\\\").template as<int32_t>())\", -12345678, reader.get(\"int32Field\").template as<int32_t>()"
               ,(char (*) [82])
                "failed: expected (-12345678) == (reader.get(\"int32Field\").template as<int32_t>())"
               ,(int *)&stack0xfffffffffffff7f8,(int *)&local_788);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  name_08.content.size_ = 0xb;
  name_08.content.ptr = "int64Field";
  DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_08);
  iVar16 = DynamicValue::Builder::AsImpl<long,_(capnp::Kind)0>::apply((Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  if ((iVar16 != -0x7048860ddf79) && (kj::_::Debug::minSeverity < 3)) {
    in_stack_fffffffffffff7f8 = 1.5714945e+35;
    in_stack_fffffffffffff7fc = 0xffff8fb7;
    name_09.content.size_ = 0xb;
    name_09.content.ptr = "int64Field";
    DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_09);
    puVar17 = (uchar *)DynamicValue::Builder::AsImpl<long,_(capnp::Kind)0>::apply
                                 ((Builder *)&local_848);
    local_788.schema.elementType._0_8_ = puVar17;
    kj::_::Debug::log<char_const(&)[91],long_long,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x157,ERROR,
               "\"failed: expected \" \"(-123456789012345ll) == (reader.get(\\\"int64Field\\\").template as<int64_t>())\", -123456789012345ll, reader.get(\"int64Field\").template as<int64_t>()"
               ,(char (*) [91])
                "failed: expected (-123456789012345ll) == (reader.get(\"int64Field\").template as<int64_t>())"
               ,(longlong *)&stack0xfffffffffffff7f8,(long *)&local_788);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  name_10.content.size_ = 0xb;
  name_10.content.ptr = "uInt8Field";
  DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_10);
  uVar11 = DynamicValue::Builder::AsImpl<unsigned_char,_(capnp::Kind)0>::apply
                     ((Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  if ((uVar11 != 0xea) && (kj::_::Debug::minSeverity < 3)) {
    in_stack_fffffffffffff7f8 = 3.27904e-43;
    name_11.content.size_ = 0xb;
    name_11.content.ptr = "uInt8Field";
    DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_11);
    uVar11 = DynamicValue::Builder::AsImpl<unsigned_char,_(capnp::Kind)0>::apply
                       ((Builder *)&local_848);
    local_788.schema.elementType.baseType._0_1_ = uVar11;
    kj::_::Debug::log<char_const(&)[77],unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x158,ERROR,
               "\"failed: expected \" \"(234u) == (reader.get(\\\"uInt8Field\\\").template as<uint8_t>())\", 234u, reader.get(\"uInt8Field\").template as<uint8_t>()"
               ,(char (*) [77])
                "failed: expected (234u) == (reader.get(\"uInt8Field\").template as<uint8_t>())",
               (uint *)&stack0xfffffffffffff7f8,(uchar *)&local_788);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  name_12.content.size_ = 0xc;
  name_12.content.ptr = "uInt16Field";
  DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_12);
  uVar13 = DynamicValue::Builder::AsImpl<unsigned_short,_(capnp::Kind)0>::apply
                     ((Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  if ((uVar13 != 0xb26e) && (kj::_::Debug::minSeverity < 3)) {
    in_stack_fffffffffffff7f8 = 6.40085e-41;
    name_13.content.size_ = 0xc;
    name_13.content.ptr = "uInt16Field";
    DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_13);
    uVar13 = DynamicValue::Builder::AsImpl<unsigned_short,_(capnp::Kind)0>::apply
                       ((Builder *)&local_848);
    local_788.schema.elementType.baseType = uVar13;
    kj::_::Debug::log<char_const(&)[81],unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x159,ERROR,
               "\"failed: expected \" \"(45678u) == (reader.get(\\\"uInt16Field\\\").template as<uint16_t>())\", 45678u, reader.get(\"uInt16Field\").template as<uint16_t>()"
               ,(char (*) [81])
                "failed: expected (45678u) == (reader.get(\"uInt16Field\").template as<uint16_t>())"
               ,(uint *)&stack0xfffffffffffff7f8,(unsigned_short *)&local_788);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  name_14.content.size_ = 0xc;
  name_14.content.ptr = "uInt32Field";
  DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_14);
  uVar15 = DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Builder *)&local_848)
  ;
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  if ((uVar15 != 0xce0a6a14) && (kj::_::Debug::minSeverity < 3)) {
    in_stack_fffffffffffff7f8 = -5.8055194e+08;
    name_15.content.size_ = 0xc;
    name_15.content.ptr = "uInt32Field";
    DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_15);
    uVar15 = DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                       ((Builder *)&local_848);
    local_788.schema.elementType.baseType = (short)uVar15;
    local_788.schema.elementType.listDepth = (char)(uVar15 >> 0x10);
    local_788.schema.elementType.isImplicitParam = (bool)(char)(uVar15 >> 0x18);
    kj::_::Debug::log<char_const(&)[86],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x15a,ERROR,
               "\"failed: expected \" \"(3456789012u) == (reader.get(\\\"uInt32Field\\\").template as<uint32_t>())\", 3456789012u, reader.get(\"uInt32Field\").template as<uint32_t>()"
               ,(char (*) [86])
                "failed: expected (3456789012u) == (reader.get(\"uInt32Field\").template as<uint32_t>())"
               ,(uint *)&stack0xfffffffffffff7f8,(uint *)&local_788);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  name_16.content.size_ = 0xc;
  name_16.content.ptr = "uInt64Field";
  DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_16);
  uVar18 = DynamicValue::Builder::AsImpl<unsigned_long,_(capnp::Kind)0>::apply
                     ((Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  if ((uVar18 != 0xab54a98ceb1f0ad2) && (kj::_::Debug::minSeverity < 3)) {
    in_stack_fffffffffffff7f8 = -1.922703e+26;
    in_stack_fffffffffffff7fc = 0xab54a98c;
    name_17.content.size_ = 0xc;
    name_17.content.ptr = "uInt64Field";
    DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_17);
    puVar17 = (uchar *)DynamicValue::Builder::AsImpl<unsigned_long,_(capnp::Kind)0>::apply
                                 ((Builder *)&local_848);
    local_788.schema.elementType._0_8_ = puVar17;
    kj::_::Debug::log<char_const(&)[98],unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x15b,ERROR,
               "\"failed: expected \" \"(12345678901234567890ull) == (reader.get(\\\"uInt64Field\\\").template as<uint64_t>())\", 12345678901234567890ull, reader.get(\"uInt64Field\").template as<uint64_t>()"
               ,(char (*) [98])
                "failed: expected (12345678901234567890ull) == (reader.get(\"uInt64Field\").template as<uint64_t>())"
               ,(unsigned_long_long *)&stack0xfffffffffffff7f8,(unsigned_long *)&local_788);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  name_18.content.size_ = 0xd;
  name_18.content.ptr = "float32Field";
  DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_18);
  fVar22 = DynamicValue::Builder::AsImpl<float,_(capnp::Kind)0>::apply((Builder *)&local_848);
  if ((fVar22 != 1234.5) || (NAN(fVar22))) {
    fVar23 = fVar22 + -1234.5;
    fVar27 = -fVar23;
    if (-fVar23 <= fVar23) {
      fVar27 = fVar23;
    }
    fVar23 = -fVar22;
    if (-fVar22 <= fVar22) {
      fVar23 = fVar22;
    }
    local_708._0_8_ = (double)(fVar23 + 1234.5) * 1e-05;
    DynamicValue::Builder::~Builder((Builder *)&local_848);
    if (((double)local_708._0_8_ <= (double)fVar27) && (kj::_::Debug::minSeverity < 3)) {
      name_19.content.size_ = 0xd;
      name_19.content.ptr = "float32Field";
      DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_19);
      in_stack_fffffffffffff7f8 =
           DynamicValue::Builder::AsImpl<float,_(capnp::Kind)0>::apply((Builder *)&local_848);
      local_788.schema.elementType.baseType = 0x5000;
      local_788.schema.elementType.listDepth = 0x9a;
      local_788.schema.elementType.isImplicitParam = true;
      kj::_::Debug::log<char_const(&)[101],float,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x15c,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(reader.get(\\\"float32Field\\\").template as<float>(), 1234.5f)\", reader.get(\"float32Field\").template as<float>(), 1234.5f"
                 ,(char (*) [101])
                  "failed: expected ::kj::_::floatAlmostEqual(reader.get(\"float32Field\").template as<float>(), 1234.5f)"
                 ,(float *)&stack0xfffffffffffff7f8,(float *)&local_788);
      goto LAB_0023cb20;
    }
  }
  else {
LAB_0023cb20:
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  name_20.content.size_ = 0xd;
  name_20.content.ptr = "float64Field";
  DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_20);
  dVar4 = DynamicValue::Builder::AsImpl<double,_(capnp::Kind)0>::apply((Builder *)&local_848);
  if ((dVar4 != -1.23e+47) || (NAN(dVar4))) {
    dVar5 = dVar4 + 1.23e+47;
    dVar24 = -dVar5;
    if (-dVar5 <= dVar5) {
      dVar24 = dVar5;
    }
    uVar25 = (undefined4)((ulong)-dVar4 >> 0x20);
    if (-dVar4 <= dVar4) {
      uVar25 = (undefined4)((ulong)dVar4 >> 0x20);
    }
    local_708._8_4_ = extraout_XMM0_Dc;
    local_708._0_8_ = ((double)CONCAT44(uVar25,SUB84(dVar4,0)) + 1.23e+47) * 1e-12;
    local_708._12_4_ = extraout_XMM0_Dd ^ 0x80000000;
    DynamicValue::Builder::~Builder((Builder *)&local_848);
    if (((double)local_708._0_8_ <= dVar24) && (kj::_::Debug::minSeverity < 3)) {
      name_21.content.size_ = 0xd;
      name_21.content.ptr = "float64Field";
      DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_21);
      dVar4 = DynamicValue::Builder::AsImpl<double,_(capnp::Kind)0>::apply((Builder *)&local_848);
      in_stack_fffffffffffff7f8 = SUB84(dVar4,0);
      in_stack_fffffffffffff7fc = (undefined4)((ulong)dVar4 >> 0x20);
      local_788.schema.elementType._0_8_ = (uchar *)0xc9b58b82c0e0bb00;
      kj::_::Debug::log<char_const(&)[103],double,double>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x15d,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(reader.get(\\\"float64Field\\\").template as<double>(), -123e45)\", reader.get(\"float64Field\").template as<double>(), -123e45"
                 ,(char (*) [103])
                  "failed: expected ::kj::_::doubleAlmostEqual(reader.get(\"float64Field\").template as<double>(), -123e45)"
                 ,(double *)&stack0xfffffffffffff7f8,(double *)&local_788);
      goto LAB_0023cc38;
    }
  }
  else {
LAB_0023cc38:
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  name_22.content.size_ = 10;
  name_22.content.ptr = "textField";
  DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_22);
  DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
            ((BuilderFor<Text> *)&stack0xfffffffffffff7f8,(Builder *)&local_848);
  if (local_800.textValue.content.ptr == (char *)0x4) {
    sVar2 = *(short *)local_800.dataValue.super_ArrayPtr<unsigned_char>.ptr;
    cVar1 = *(char *)((long)&((local_800.anyPointerValue.builder.segment)->super_SegmentReader).
                             arena + 2);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
    if (cVar1 != 'o' || sVar2 != 0x6f66) goto LAB_0023cca6;
  }
  else {
    DynamicValue::Builder::~Builder((Builder *)&local_848);
LAB_0023cca6:
    if (kj::_::Debug::minSeverity < 3) {
      name_23.content.size_ = 10;
      name_23.content.ptr = "textField";
      DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_23);
      DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                ((BuilderFor<Text> *)&stack0xfffffffffffff7f8,(Builder *)&local_848);
      kj::_::Debug::log<char_const(&)[74],char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x15e,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (reader.get(\\\"textField\\\").template as<Text>())\", \"foo\", reader.get(\"textField\").template as<Text>()"
                 ,(char (*) [74])
                  "failed: expected (\"foo\") == (reader.get(\"textField\").template as<Text>())",
                 (char (*) [4])"foo",(BuilderFor<Text> *)&stack0xfffffffffffff7f8);
      DynamicValue::Builder::~Builder((Builder *)&local_848);
    }
  }
  name_24.content.size_ = 10;
  name_24.content.ptr = "dataField";
  DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_24);
  BVar28 = DynamicValue::Builder::AsImpl<capnp::Data,_(capnp::Kind)1>::apply((Builder *)&local_848);
  if (BVar28.super_ArrayPtr<unsigned_char>.size_ == 3) {
    lVar19 = 0;
    do {
      if ("\"failed: expected \" \"(\\\"foo\\\") == (bar)\", \"foo\", bar"[lVar19 + 0x31] !=
          BVar28.super_ArrayPtr<unsigned_char>.ptr[lVar19]) goto LAB_0023cd5d;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
LAB_0023cde3:
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  else {
LAB_0023cd5d:
    DynamicValue::Builder::~Builder((Builder *)&local_848);
    if (kj::_::Debug::minSeverity < 3) {
      in_stack_fffffffffffff7f8 = 3.99168e-39;
      in_stack_fffffffffffff7fc = 0;
      local_800.intValue = 3;
      name_25.content.size_ = 10;
      name_25.content.ptr = "dataField";
      DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_25);
      local_788.schema.elementType =
           (Type)DynamicValue::Builder::AsImpl<capnp::Data,_(capnp::Kind)1>::apply
                           ((Builder *)&local_848);
      kj::_::Debug::log<char_const(&)[80],capnp::Data::Reader,capnp::Data::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x15f,ERROR,
                 "\"failed: expected \" \"(data(\\\"bar\\\")) == (reader.get(\\\"dataField\\\").template as<Data>())\", data(\"bar\"), reader.get(\"dataField\").template as<Data>()"
                 ,(char (*) [80])
                  "failed: expected (data(\"bar\")) == (reader.get(\"dataField\").template as<Data>())"
                 ,(Reader *)&stack0xfffffffffffff7f8,(Builder *)&local_788);
      goto LAB_0023cde3;
    }
  }
  name_26.content.size_ = 0xc;
  name_26.content.ptr = "structField";
  DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_26);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&local_7b8,(Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  name_27.content.size_ = 10;
  name_27.content.ptr = "voidField";
  DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_27);
  DynamicValue::Builder::AsImpl<capnp::Void,_(capnp::Kind)0>::apply((Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  name_28.content.size_ = 10;
  name_28.content.ptr = "boolField";
  DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_28);
  BVar9 = DynamicValue::Builder::AsImpl<bool,_(capnp::Kind)0>::apply((Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  if (!BVar9 && kj::_::Debug::minSeverity < 3) {
    in_stack_fffffffffffff7f8 = (float)CONCAT31((int3)((uint)in_stack_fffffffffffff7f8 >> 8),1);
    name_29.content.size_ = 10;
    name_29.content.ptr = "boolField";
    DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_29);
    BVar9 = DynamicValue::Builder::AsImpl<bool,_(capnp::Kind)0>::apply((Builder *)&local_848);
    local_788.schema.elementType.baseType._0_1_ = BVar9;
    kj::_::Debug::log<char_const(&)[76],bool,bool>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x163,ERROR,
               "\"failed: expected \" \"(true) == (subReader.get(\\\"boolField\\\").template as<bool>())\", true, subReader.get(\"boolField\").template as<bool>()"
               ,(char (*) [76])
                "failed: expected (true) == (subReader.get(\"boolField\").template as<bool>())",
               (bool *)&stack0xfffffffffffff7f8,(bool *)&local_788);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  name_30.content.size_ = 10;
  name_30.content.ptr = "int8Field";
  DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_30);
  iVar10 = DynamicValue::Builder::AsImpl<signed_char,_(capnp::Kind)0>::apply((Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  if ((iVar10 != -0xc) && (kj::_::Debug::minSeverity < 3)) {
    in_stack_fffffffffffff7f8 = -NAN;
    name_31.content.size_ = 10;
    name_31.content.ptr = "int8Field";
    DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_31);
    iVar10 = DynamicValue::Builder::AsImpl<signed_char,_(capnp::Kind)0>::apply
                       ((Builder *)&local_848);
    local_788.schema.elementType.baseType._0_1_ = iVar10;
    kj::_::Debug::log<char_const(&)[77],int,signed_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x164,ERROR,
               "\"failed: expected \" \"(-12) == (subReader.get(\\\"int8Field\\\").template as<int8_t>())\", -12, subReader.get(\"int8Field\").template as<int8_t>()"
               ,(char (*) [77])
                "failed: expected (-12) == (subReader.get(\"int8Field\").template as<int8_t>())",
               (int *)&stack0xfffffffffffff7f8,(char *)&local_788);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  name_32.content.size_ = 0xb;
  name_32.content.ptr = "int16Field";
  DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_32);
  iVar12 = DynamicValue::Builder::AsImpl<short,_(capnp::Kind)0>::apply((Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  if ((iVar12 != 0xd80) && (kj::_::Debug::minSeverity < 3)) {
    in_stack_fffffffffffff7f8 = 4.84289e-42;
    name_33.content.size_ = 0xb;
    name_33.content.ptr = "int16Field";
    DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_33);
    iVar12 = DynamicValue::Builder::AsImpl<short,_(capnp::Kind)0>::apply((Builder *)&local_848);
    local_788.schema.elementType.baseType = iVar12;
    kj::_::Debug::log<char_const(&)[80],int,short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x165,ERROR,
               "\"failed: expected \" \"(3456) == (subReader.get(\\\"int16Field\\\").template as<int16_t>())\", 3456, subReader.get(\"int16Field\").template as<int16_t>()"
               ,(char (*) [80])
                "failed: expected (3456) == (subReader.get(\"int16Field\").template as<int16_t>())",
               (int *)&stack0xfffffffffffff7f8,(short *)&local_788);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  name_34.content.size_ = 0xb;
  name_34.content.ptr = "int32Field";
  DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_34);
  iVar14 = DynamicValue::Builder::AsImpl<int,_(capnp::Kind)0>::apply((Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  if ((iVar14 != -0x4b3eff2) && (kj::_::Debug::minSeverity < 3)) {
    in_stack_fffffffffffff7f8 = -1.0595542e+36;
    name_35.content.size_ = 0xb;
    name_35.content.ptr = "int32Field";
    DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_35);
    iVar14 = DynamicValue::Builder::AsImpl<int,_(capnp::Kind)0>::apply((Builder *)&local_848);
    local_788.schema.elementType.baseType = (short)iVar14;
    local_788.schema.elementType.listDepth = (char)((uint)iVar14 >> 0x10);
    local_788.schema.elementType.isImplicitParam = (bool)(char)((uint)iVar14 >> 0x18);
    kj::_::Debug::log<char_const(&)[85],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x166,ERROR,
               "\"failed: expected \" \"(-78901234) == (subReader.get(\\\"int32Field\\\").template as<int32_t>())\", -78901234, subReader.get(\"int32Field\").template as<int32_t>()"
               ,(char (*) [85])
                "failed: expected (-78901234) == (subReader.get(\"int32Field\").template as<int32_t>())"
               ,(int *)&stack0xfffffffffffff7f8,(int *)&local_788);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  name_36.content.size_ = 0xb;
  name_36.content.ptr = "int64Field";
  DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_36);
  iVar16 = DynamicValue::Builder::AsImpl<long,_(capnp::Kind)0>::apply((Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  if ((iVar16 != 0x33a638e8734e) && (kj::_::Debug::minSeverity < 3)) {
    in_stack_fffffffffffff7f8 = 0.00011084099;
    in_stack_fffffffffffff7fc = 0x33a6;
    name_37.content.size_ = 0xb;
    name_37.content.ptr = "int64Field";
    DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_37);
    puVar17 = (uchar *)DynamicValue::Builder::AsImpl<long,_(capnp::Kind)0>::apply
                                 ((Builder *)&local_848);
    local_788.schema.elementType._0_8_ = puVar17;
    kj::_::Debug::log<char_const(&)[92],long_long,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x167,ERROR,
               "\"failed: expected \" \"(56789012345678ll) == (subReader.get(\\\"int64Field\\\").template as<int64_t>())\", 56789012345678ll, subReader.get(\"int64Field\").template as<int64_t>()"
               ,(char (*) [92])
                "failed: expected (56789012345678ll) == (subReader.get(\"int64Field\").template as<int64_t>())"
               ,(longlong *)&stack0xfffffffffffff7f8,(long *)&local_788);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  name_38.content.size_ = 0xb;
  name_38.content.ptr = "uInt8Field";
  DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_38);
  uVar11 = DynamicValue::Builder::AsImpl<unsigned_char,_(capnp::Kind)0>::apply
                     ((Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  if ((uVar11 != 'Z') && (kj::_::Debug::minSeverity < 3)) {
    in_stack_fffffffffffff7f8 = 1.26117e-43;
    name_39.content.size_ = 0xb;
    name_39.content.ptr = "uInt8Field";
    DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_39);
    uVar11 = DynamicValue::Builder::AsImpl<unsigned_char,_(capnp::Kind)0>::apply
                       ((Builder *)&local_848);
    local_788.schema.elementType.baseType._0_1_ = uVar11;
    kj::_::Debug::log<char_const(&)[79],unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x168,ERROR,
               "\"failed: expected \" \"(90u) == (subReader.get(\\\"uInt8Field\\\").template as<uint8_t>())\", 90u, subReader.get(\"uInt8Field\").template as<uint8_t>()"
               ,(char (*) [79])
                "failed: expected (90u) == (subReader.get(\"uInt8Field\").template as<uint8_t>())",
               (uint *)&stack0xfffffffffffff7f8,(uchar *)&local_788);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  name_40.content.size_ = 0xc;
  name_40.content.ptr = "uInt16Field";
  DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_40);
  uVar13 = DynamicValue::Builder::AsImpl<unsigned_short,_(capnp::Kind)0>::apply
                     ((Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  if ((uVar13 != 0x4d2) && (kj::_::Debug::minSeverity < 3)) {
    in_stack_fffffffffffff7f8 = 1.7292e-42;
    name_41.content.size_ = 0xc;
    name_41.content.ptr = "uInt16Field";
    DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_41);
    uVar13 = DynamicValue::Builder::AsImpl<unsigned_short,_(capnp::Kind)0>::apply
                       ((Builder *)&local_848);
    local_788.schema.elementType.baseType = uVar13;
    kj::_::Debug::log<char_const(&)[83],unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x169,ERROR,
               "\"failed: expected \" \"(1234u) == (subReader.get(\\\"uInt16Field\\\").template as<uint16_t>())\", 1234u, subReader.get(\"uInt16Field\").template as<uint16_t>()"
               ,(char (*) [83])
                "failed: expected (1234u) == (subReader.get(\"uInt16Field\").template as<uint16_t>())"
               ,(uint *)&stack0xfffffffffffff7f8,(unsigned_short *)&local_788);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  name_42.content.size_ = 0xc;
  name_42.content.ptr = "uInt32Field";
  DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_42);
  uVar15 = DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Builder *)&local_848)
  ;
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  if ((uVar15 != 0x3628814) && (kj::_::Debug::minSeverity < 3)) {
    in_stack_fffffffffffff7f8 = 6.657164e-37;
    name_43.content.size_ = 0xc;
    name_43.content.ptr = "uInt32Field";
    DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_43);
    uVar15 = DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                       ((Builder *)&local_848);
    local_788.schema.elementType.baseType = (short)uVar15;
    local_788.schema.elementType.listDepth = (char)(uVar15 >> 0x10);
    local_788.schema.elementType.isImplicitParam = (bool)(char)(uVar15 >> 0x18);
    kj::_::Debug::log<char_const(&)[87],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x16a,ERROR,
               "\"failed: expected \" \"(56789012u) == (subReader.get(\\\"uInt32Field\\\").template as<uint32_t>())\", 56789012u, subReader.get(\"uInt32Field\").template as<uint32_t>()"
               ,(char (*) [87])
                "failed: expected (56789012u) == (subReader.get(\"uInt32Field\").template as<uint32_t>())"
               ,(uint *)&stack0xfffffffffffff7f8,(uint *)&local_788);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  name_44.content.size_ = 0xc;
  name_44.content.ptr = "uInt64Field";
  DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_44);
  uVar18 = DynamicValue::Builder::AsImpl<unsigned_long,_(capnp::Kind)0>::apply
                     ((Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  if ((uVar18 != 0x4cc1921126f0ad2) && (kj::_::Debug::minSeverity < 3)) {
    in_stack_fffffffffffff7f8 = 7.542844e-28;
    in_stack_fffffffffffff7fc = 0x4cc1921;
    name_45.content.size_ = 0xc;
    name_45.content.ptr = "uInt64Field";
    DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_45);
    puVar17 = (uchar *)DynamicValue::Builder::AsImpl<unsigned_long,_(capnp::Kind)0>::apply
                                 ((Builder *)&local_848);
    local_788.schema.elementType._0_8_ = puVar17;
    kj::_::Debug::log<char_const(&)[99],unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x16b,ERROR,
               "\"failed: expected \" \"(345678901234567890ull) == (subReader.get(\\\"uInt64Field\\\").template as<uint64_t>())\", 345678901234567890ull, subReader.get(\"uInt64Field\").template as<uint64_t>()"
               ,(char (*) [99])
                "failed: expected (345678901234567890ull) == (subReader.get(\"uInt64Field\").template as<uint64_t>())"
               ,(unsigned_long_long *)&stack0xfffffffffffff7f8,(unsigned_long *)&local_788);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  name_46.content.size_ = 0xd;
  name_46.content.ptr = "float32Field";
  DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_46);
  fVar22 = DynamicValue::Builder::AsImpl<float,_(capnp::Kind)0>::apply((Builder *)&local_848);
  if ((fVar22 != -1.25e-10) || (NAN(fVar22))) {
    fVar23 = fVar22 + 1.25e-10;
    fVar27 = -fVar23;
    if (-fVar23 <= fVar23) {
      fVar27 = fVar23;
    }
    fVar23 = -fVar22;
    if (-fVar22 <= fVar22) {
      fVar23 = fVar22;
    }
    local_708._0_8_ = (double)(fVar23 + 1.25e-10) * 1e-05;
    DynamicValue::Builder::~Builder((Builder *)&local_848);
    if (((double)local_708._0_8_ <= (double)fVar27) && (kj::_::Debug::minSeverity < 3)) {
      name_47.content.size_ = 0xd;
      name_47.content.ptr = "float32Field";
      DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_47);
      in_stack_fffffffffffff7f8 =
           DynamicValue::Builder::AsImpl<float,_(capnp::Kind)0>::apply((Builder *)&local_848);
      local_788.schema.elementType.baseType = 0x705f;
      local_788.schema.elementType.listDepth = '\t';
      local_788.schema.elementType.isImplicitParam = true;
      kj::_::Debug::log<char_const(&)[107],float,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x16c,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(subReader.get(\\\"float32Field\\\").template as<float>(), -1.25e-10f)\", subReader.get(\"float32Field\").template as<float>(), -1.25e-10f"
                 ,(char (*) [107])
                  "failed: expected ::kj::_::floatAlmostEqual(subReader.get(\"float32Field\").template as<float>(), -1.25e-10f)"
                 ,(float *)&stack0xfffffffffffff7f8,(float *)&local_788);
      goto LAB_0023d5dc;
    }
  }
  else {
LAB_0023d5dc:
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  name_48.content.size_ = 0xd;
  name_48.content.ptr = "float64Field";
  DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_48);
  dVar4 = DynamicValue::Builder::AsImpl<double,_(capnp::Kind)0>::apply((Builder *)&local_848);
  if ((dVar4 != 345.0) || (NAN(dVar4))) {
    dVar24 = dVar4 + -345.0;
    dVar5 = (double)((ulong)dVar24 ^ (ulong)DAT_002bee90);
    uVar25 = SUB84(dVar5,0);
    uVar26 = (undefined4)((ulong)dVar5 >> 0x20);
    if (dVar5 <= dVar24) {
      uVar25 = SUB84(dVar24,0);
      uVar26 = (undefined4)((ulong)dVar24 >> 0x20);
    }
    local_7c8 = (double)CONCAT44(uVar26,uVar25);
    dVar5 = (double)((ulong)DAT_002bee90 ^ (ulong)dVar4);
    uVar25 = SUB84(dVar5,0);
    uVar26 = (undefined4)((ulong)dVar5 >> 0x20);
    uVar6 = DAT_002bee90._8_8_ ^ CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00);
    if (dVar5 <= dVar4) {
      uVar25 = SUB84(dVar4,0);
      uVar26 = (undefined4)((ulong)dVar4 >> 0x20);
    }
    local_708._8_4_ = (int)uVar6;
    local_708._0_8_ = ((double)CONCAT44(uVar26,uVar25) + 345.0) * 1e-12;
    local_708._12_4_ = (int)(uVar6 >> 0x20);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
    if (((double)local_708._0_8_ <= local_7c8) && (kj::_::Debug::minSeverity < 3)) {
      name_49.content.size_ = 0xd;
      name_49.content.ptr = "float64Field";
      DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_49);
      dVar4 = DynamicValue::Builder::AsImpl<double,_(capnp::Kind)0>::apply((Builder *)&local_848);
      in_stack_fffffffffffff7f8 = SUB84(dVar4,0);
      in_stack_fffffffffffff7fc = (undefined4)((ulong)dVar4 >> 0x20);
      local_788.schema.elementType.baseType = 0x159;
      local_788.schema.elementType.listDepth = '\0';
      local_788.schema.elementType.isImplicitParam = false;
      kj::_::Debug::log<char_const(&)[102],double,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x16d,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(subReader.get(\\\"float64Field\\\").template as<double>(), 345)\", subReader.get(\"float64Field\").template as<double>(), 345"
                 ,(char (*) [102])
                  "failed: expected ::kj::_::doubleAlmostEqual(subReader.get(\"float64Field\").template as<double>(), 345)"
                 ,(double *)&stack0xfffffffffffff7f8,(int *)&local_788);
      goto LAB_0023d6f7;
    }
  }
  else {
LAB_0023d6f7:
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  name_50.content.size_ = 10;
  name_50.content.ptr = "textField";
  DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_50);
  DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
            ((BuilderFor<Text> *)&stack0xfffffffffffff7f8,(Builder *)&local_848);
  if (local_800.textValue.content.ptr == (char *)0x4) {
    sVar2 = *(short *)local_800.dataValue.super_ArrayPtr<unsigned_char>.ptr;
    cVar1 = *(char *)((long)&((local_800.anyPointerValue.builder.segment)->super_SegmentReader).
                             arena + 2);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
    if (cVar1 != 'z' || sVar2 != 0x6162) goto LAB_0023d76a;
  }
  else {
    DynamicValue::Builder::~Builder((Builder *)&local_848);
LAB_0023d76a:
    if (kj::_::Debug::minSeverity < 3) {
      name_51.content.size_ = 10;
      name_51.content.ptr = "textField";
      DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_51);
      DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                ((BuilderFor<Text> *)&stack0xfffffffffffff7f8,(Builder *)&local_848);
      kj::_::Debug::log<char_const(&)[77],char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x16e,ERROR,
                 "\"failed: expected \" \"(\\\"baz\\\") == (subReader.get(\\\"textField\\\").template as<Text>())\", \"baz\", subReader.get(\"textField\").template as<Text>()"
                 ,(char (*) [77])
                  "failed: expected (\"baz\") == (subReader.get(\"textField\").template as<Text>())"
                 ,(char (*) [4])0x2be676,(BuilderFor<Text> *)&stack0xfffffffffffff7f8);
      DynamicValue::Builder::~Builder((Builder *)&local_848);
    }
  }
  name_52.content.size_ = 10;
  name_52.content.ptr = "dataField";
  DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_52);
  BVar28 = DynamicValue::Builder::AsImpl<capnp::Data,_(capnp::Kind)1>::apply((Builder *)&local_848);
  if (BVar28.super_ArrayPtr<unsigned_char>.size_ == 3) {
    lVar19 = 0;
    do {
      if ("bazqux"[lVar19 + 3] != BVar28.super_ArrayPtr<unsigned_char>.ptr[lVar19])
      goto LAB_0023d82b;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
LAB_0023d8ba:
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  else {
LAB_0023d82b:
    DynamicValue::Builder::~Builder((Builder *)&local_848);
    if (kj::_::Debug::minSeverity < 3) {
      in_stack_fffffffffffff7f8 = 4.063795e-39;
      in_stack_fffffffffffff7fc = 0;
      local_800.intValue = 3;
      name_53.content.size_ = 10;
      name_53.content.ptr = "dataField";
      DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_53);
      local_788.schema.elementType =
           (Type)DynamicValue::Builder::AsImpl<capnp::Data,_(capnp::Kind)1>::apply
                           ((Builder *)&local_848);
      kj::_::Debug::log<char_const(&)[83],capnp::Data::Reader,capnp::Data::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x16f,ERROR,
                 "\"failed: expected \" \"(data(\\\"qux\\\")) == (subReader.get(\\\"dataField\\\").template as<Data>())\", data(\"qux\"), subReader.get(\"dataField\").template as<Data>()"
                 ,(char (*) [83])
                  "failed: expected (data(\"qux\")) == (subReader.get(\"dataField\").template as<Data>())"
                 ,(Reader *)&stack0xfffffffffffff7f8,(Builder *)&local_788);
      goto LAB_0023d8ba;
    }
  }
  name_54.content.size_ = 0xc;
  name_54.content.ptr = "structField";
  DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_54);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&local_788,(Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  name_55.content.size_ = 10;
  name_55.content.ptr = "textField";
  DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&local_788,name_55);
  DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
            ((BuilderFor<Text> *)&stack0xfffffffffffff7f8,(Builder *)&local_848);
  if (local_800.textValue.content.ptr == (char *)0x7) {
    iVar3 = *(int *)local_800.dataValue.super_ArrayPtr<unsigned_char>.ptr;
    sVar2 = *(short *)((long)&((local_800.anyPointerValue.builder.segment)->super_SegmentReader).
                              arena + 4);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
    if (sVar2 != 0x6465 || iVar3 != 0x7473656e) goto LAB_0023d968;
  }
  else {
    DynamicValue::Builder::~Builder((Builder *)&local_848);
LAB_0023d968:
    if (kj::_::Debug::minSeverity < 3) {
      name_56.content.size_ = 10;
      name_56.content.ptr = "textField";
      DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&local_788,name_56);
      DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                ((BuilderFor<Text> *)&stack0xfffffffffffff7f8,(Builder *)&local_848);
      kj::_::Debug::log<char_const(&)[83],char_const(&)[7],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x172,ERROR,
                 "\"failed: expected \" \"(\\\"nested\\\") == (subSubReader.get(\\\"textField\\\").template as<Text>())\", \"nested\", subSubReader.get(\"textField\").template as<Text>()"
                 ,(char (*) [83])
                  "failed: expected (\"nested\") == (subSubReader.get(\"textField\").template as<Text>())"
                 ,(char (*) [7])0x2cbda0,(BuilderFor<Text> *)&stack0xfffffffffffff7f8);
      DynamicValue::Builder::~Builder((Builder *)&local_848);
    }
  }
  name_57.content.size_ = 0xc;
  name_57.content.ptr = "structField";
  DynamicStruct::Builder::get((Builder *)&stack0xfffffffffffff7f8,(Builder *)&local_788,name_57);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&local_738,(Builder *)&stack0xfffffffffffff7f8);
  name_58.content.size_ = 10;
  name_58.content.ptr = "textField";
  DynamicStruct::Builder::get((Builder *)&local_848,&local_738,name_58);
  DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
            (&local_750,(Builder *)&local_848);
  bVar21 = true;
  if (local_750.content.size_ == 0xe) {
    bVar21 = *(long *)((long)local_750.content.ptr + 5) != 0x64657473656e2079 ||
             *(long *)local_750.content.ptr != 0x6e20796c6c616572;
  }
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&stack0xfffffffffffff7f8);
  if ((bool)(bVar21 & kj::_::Debug::minSeverity < 3)) {
    name_59.content.size_ = 0xc;
    name_59.content.ptr = "structField";
    DynamicStruct::Builder::get((Builder *)&stack0xfffffffffffff7f8,(Builder *)&local_788,name_59);
    DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              (&local_738,(Builder *)&stack0xfffffffffffff7f8);
    name_60.content.size_ = 10;
    name_60.content.ptr = "textField";
    DynamicStruct::Builder::get((Builder *)&local_848,&local_738,name_60);
    DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
              (&local_750,(Builder *)&local_848);
    kj::_::Debug::log<char_const(&)[139],char_const(&)[14],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x174,ERROR,
               "\"failed: expected \" \"(\\\"really nested\\\") == (subSubReader.get(\\\"structField\\\").template as<DynamicStruct>() .get(\\\"textField\\\").template as<Text>())\", \"really nested\", subSubReader.get(\"structField\").template as<DynamicStruct>() .get(\"textField\").template as<Text>()"
               ,(char (*) [139])
                "failed: expected (\"really nested\") == (subSubReader.get(\"structField\").template as<DynamicStruct>() .get(\"textField\").template as<Text>())"
               ,(char (*) [14])"really nested",&local_750);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
    DynamicValue::Builder::~Builder((Builder *)&stack0xfffffffffffff7f8);
  }
  name_61.content.size_ = 10;
  name_61.content.ptr = "enumField";
  DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_61);
  DynamicValue::Builder::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply((Builder *)&local_848);
  e._8_4_ = in_stack_fffffffffffff7f8;
  e.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffff7f0;
  e._12_4_ = in_stack_fffffffffffff7fc;
  RVar29 = anon_unknown_129::name(e);
  if (RVar29.super_StringPtr.content.size_ == 4) {
    sVar2 = *RVar29.super_StringPtr.content.ptr;
    sVar7 = RVar29.super_StringPtr.content.ptr[1];
    DynamicValue::Builder::~Builder((Builder *)&local_848);
    if ((char)sVar7 != 'z' || sVar2 != 0x6162) goto LAB_0023dbae;
  }
  else {
    DynamicValue::Builder::~Builder((Builder *)&local_848);
LAB_0023dbae:
    if (kj::_::Debug::minSeverity < 3) {
      name_62.content.size_ = 10;
      name_62.content.ptr = "enumField";
      DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_62);
      DynamicValue::Builder::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply
                ((Builder *)&local_848);
      e_00._8_4_ = in_stack_fffffffffffff7f8;
      e_00.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffff7f0;
      e_00._12_4_ = in_stack_fffffffffffff7fc;
      RVar29 = anon_unknown_129::name(e_00);
      in_stack_fffffffffffff7f8 = RVar29.super_StringPtr.content.ptr._0_4_;
      in_stack_fffffffffffff7fc = RVar29.super_StringPtr.content.ptr._4_4_;
      kj::_::Debug::log<char_const(&)[90],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x176,ERROR,
                 "\"failed: expected \" \"(\\\"baz\\\") == (name(subReader.get(\\\"enumField\\\").template as<DynamicEnum>()))\", \"baz\", name(subReader.get(\"enumField\").template as<DynamicEnum>())"
                 ,(char (*) [90])
                  "failed: expected (\"baz\") == (name(subReader.get(\"enumField\").template as<DynamicEnum>()))"
                 ,(char (*) [4])0x2be676,(Reader *)&stack0xfffffffffffff7f8);
      DynamicValue::Builder::~Builder((Builder *)&local_848);
    }
  }
  name_63.content.size_ = 9;
  name_63.content.ptr = "voidList";
  sVar20 = 9;
  DynamicStruct::Builder::get(&local_70,&local_7b8,name_63);
  expected._M_len = sVar20;
  expected._M_array = (iterator)0x3;
  checkList<capnp::Void,capnp::DynamicValue::Builder>((_ *)&local_70,(Builder *)&local_848,expected)
  ;
  DynamicValue::Builder::~Builder(&local_70);
  name_64.content.size_ = 9;
  name_64.content.ptr = "boolList";
  sVar20 = 9;
  DynamicStruct::Builder::get(&local_b0,&local_7b8,name_64);
  local_848.exception._0_5_ = 0x101000100;
  expected_00._M_len = sVar20;
  expected_00._M_array = (iterator)0x5;
  checkList<bool,capnp::DynamicValue::Builder>((_ *)&local_b0,(Builder *)&local_848,expected_00);
  DynamicValue::Builder::~Builder(&local_b0);
  name_65.content.size_ = 9;
  name_65.content.ptr = "int8List";
  sVar20 = 9;
  DynamicStruct::Builder::get(&local_f0,&local_7b8,name_65);
  local_848.exception._0_4_ = 0x7f80de0c;
  expected_01._M_len = sVar20;
  expected_01._M_array = (iterator)0x4;
  checkList<signed_char,capnp::DynamicValue::Builder>
            ((_ *)&local_f0,(Builder *)&local_848,expected_01);
  DynamicValue::Builder::~Builder(&local_f0);
  name_66.content.size_ = 10;
  name_66.content.ptr = "int16List";
  sVar20 = 10;
  DynamicStruct::Builder::get(&local_130,&local_7b8,name_66);
  local_848.exception = (Exception *)0x7fff8000e9d204d2;
  expected_02._M_len = sVar20;
  expected_02._M_array = (iterator)0x4;
  checkList<short,capnp::DynamicValue::Builder>((_ *)&local_130,(Builder *)&local_848,expected_02);
  DynamicValue::Builder::~Builder(&local_130);
  name_67.content.size_ = 10;
  name_67.content.ptr = "int32List";
  sVar20 = 10;
  DynamicStruct::Builder::get(&local_170,&local_7b8,name_67);
  local_848.exception = (Exception *)0xfaa0d34000bc614e;
  pcStack_840 = (char *)0x7fffffff80000000;
  expected_03._M_len = sVar20;
  expected_03._M_array = (iterator)0x4;
  checkList<int,capnp::DynamicValue::Builder>((_ *)&local_170,(Builder *)&local_848,expected_03);
  DynamicValue::Builder::~Builder(&local_170);
  name_68.content.size_ = 10;
  name_68.content.ptr = "int64List";
  sVar20 = 10;
  DynamicStruct::Builder::get(&local_1b0,&local_7b8,name_68);
  local_838 = (char *)0x8000000000000000;
  uStack_830 = 0x7fffffffffffffff;
  local_848.exception = (Exception *)0x7048860ddf79;
  pcStack_840 = (char *)0xfffd968afd13752e;
  expected_04._M_len = sVar20;
  expected_04._M_array = (iterator)0x4;
  checkList<long,capnp::DynamicValue::Builder>((_ *)&local_1b0,(Builder *)&local_848,expected_04);
  DynamicValue::Builder::~Builder(&local_1b0);
  name_69.content.size_ = 10;
  name_69.content.ptr = "uInt8List";
  sVar20 = 10;
  DynamicStruct::Builder::get(&local_1f0,&local_7b8,name_69);
  local_848.exception._0_4_ = 0xff00220c;
  expected_05._M_len = sVar20;
  expected_05._M_array = (iterator)0x4;
  checkList<unsigned_char,capnp::DynamicValue::Builder>
            ((_ *)&local_1f0,(Builder *)&local_848,expected_05);
  DynamicValue::Builder::~Builder(&local_1f0);
  name_70.content.size_ = 0xb;
  name_70.content.ptr = "uInt16List";
  sVar20 = 0xb;
  DynamicStruct::Builder::get(&local_230,&local_7b8,name_70);
  local_848.exception = (Exception *)0xffff0000162e04d2;
  expected_06._M_len = sVar20;
  expected_06._M_array = (iterator)0x4;
  checkList<unsigned_short,capnp::DynamicValue::Builder>
            ((_ *)&local_230,(Builder *)&local_848,expected_06);
  DynamicValue::Builder::~Builder(&local_230);
  name_71.content.size_ = 0xb;
  name_71.content.ptr = "uInt32List";
  sVar20 = 0xb;
  DynamicStruct::Builder::get(&local_270,&local_7b8,name_71);
  local_848.exception = (Exception *)0x55f2cc000bc614e;
  pcStack_840 = (char *)0xffffffff00000000;
  expected_07._M_len = sVar20;
  expected_07._M_array = (iterator)0x4;
  checkList<unsigned_int,capnp::DynamicValue::Builder>
            ((_ *)&local_270,(Builder *)&local_848,expected_07);
  DynamicValue::Builder::~Builder(&local_270);
  name_72.content.size_ = 0xb;
  name_72.content.ptr = "uInt64List";
  sVar20 = 0xb;
  DynamicStruct::Builder::get(&local_2b0,&local_7b8,name_72);
  local_838 = (char *)0x0;
  uStack_830 = 0xffffffffffffffff;
  local_848.exception = (Exception *)0x7048860ddf79;
  pcStack_840 = (char *)0x2697502ec8ad2;
  expected_08._M_len = sVar20;
  expected_08._M_array = (iterator)0x4;
  checkList<unsigned_long,capnp::DynamicValue::Builder>
            ((_ *)&local_2b0,(Builder *)&local_848,expected_08);
  DynamicValue::Builder::~Builder(&local_2b0);
  name_73.content.size_ = 0xc;
  name_73.content.ptr = "float32List";
  sVar20 = 0xc;
  DynamicStruct::Builder::get(&local_2f0,&local_7b8,name_73);
  local_848.exception = (Exception *)0x4996b43800000000;
  pcStack_840 = (char *)0xfcf0bdc27cf0bdc2;
  local_838 = (char *)0x82081cea02081cea;
  expected_09._M_len = sVar20;
  expected_09._M_array = (iterator)0x6;
  checkList<float,capnp::DynamicValue::Builder>((_ *)&local_2f0,(Builder *)&local_848,expected_09);
  DynamicValue::Builder::~Builder(&local_2f0);
  name_74.content.size_ = 0xc;
  name_74.content.ptr = "float64List";
  sVar20 = 0xc;
  DynamicStruct::Builder::get(&local_330,&local_7b8,name_74);
  local_828 = (char *)0x66789e3750f791;
  uStack_820 = (byte *)0x8066789e3750f791;
  local_838 = (char *)0x7f76c8e5ca239029;
  uStack_830 = (SegmentBuilder *)0xff76c8e5ca239029;
  local_848.exception = (Exception *)0x0;
  pcStack_840 = (char *)0x42dc12218377de40;
  expected_10._M_len = sVar20;
  expected_10._M_array = (iterator)0x6;
  checkList<double,capnp::DynamicValue::Builder>((_ *)&local_330,(Builder *)&local_848,expected_10);
  DynamicValue::Builder::~Builder(&local_330);
  name_75.content.size_ = 9;
  name_75.content.ptr = "textList";
  sVar20 = 9;
  DynamicStruct::Builder::get(&local_370,&local_7b8,name_75);
  local_848.exception = (Exception *)0x2c403c;
  pcStack_840 = (char *)0x5;
  local_838 = "corge";
  uStack_830 = 6;
  local_828 = "grault";
  uStack_820 = (byte *)0x7;
  expected_11._M_len = sVar20;
  expected_11._M_array = (iterator)0x3;
  checkList<capnp::Text,capnp::DynamicValue::Builder>
            ((_ *)&local_370,(Builder *)&local_848,expected_11);
  DynamicValue::Builder::~Builder(&local_370);
  name_76.content.size_ = 9;
  name_76.content.ptr = "dataList";
  sVar20 = 9;
  DynamicStruct::Builder::get(&local_3b0,&local_7b8,name_76);
  local_848.exception = (Exception *)0x2c7fbe;
  pcStack_840 = (char *)0x6;
  local_838 = anon_var_dwarf_83c37;
  uStack_830 = 5;
  local_828 = "fred";
  uStack_820 = (byte *)0x4;
  expected_12._M_len = sVar20;
  expected_12._M_array = (iterator)0x3;
  checkList<capnp::Data,capnp::DynamicValue::Builder>
            ((_ *)&local_3b0,(Builder *)&local_848,expected_12);
  DynamicValue::Builder::~Builder(&local_3b0);
  name_77.content.size_ = 0xb;
  name_77.content.ptr = "structList";
  DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_77);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            (&local_788,(Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  if (local_788.builder.elementCount != 3) {
    local_738.schema.super_Schema.raw._0_4_ = local_788.builder.elementCount;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_848,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x189,FAILED,"(3u) == (listReader.size())","3u, listReader.size()",
               (uint *)&stack0xfffffffffffff7f8,(uint *)&local_738);
    kj::_::Debug::Fault::fatal(&local_848);
  }
  DynamicList::Builder::operator[]((Builder *)&stack0xfffffffffffff7f8,&local_788,0);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&local_738,(Builder *)&stack0xfffffffffffff7f8);
  name_78.content.size_ = 10;
  name_78.content.ptr = "textField";
  DynamicStruct::Builder::get((Builder *)&local_848,&local_738,name_78);
  DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
            (&local_750,(Builder *)&local_848);
  bVar21 = true;
  if (local_750.content.size_ == 0xf) {
    bVar21 = *(long *)((long)local_750.content.ptr + 6) != 0x31207473696c7463 ||
             *(long *)local_750.content.ptr != 0x7463757274732078;
  }
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&stack0xfffffffffffff7f8);
  if ((bool)(bVar21 & kj::_::Debug::minSeverity < 3)) {
    DynamicList::Builder::operator[]((Builder *)&stack0xfffffffffffff7f8,&local_788,0);
    DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              (&local_738,(Builder *)&stack0xfffffffffffff7f8);
    name_79.content.size_ = 10;
    name_79.content.ptr = "textField";
    DynamicStruct::Builder::get((Builder *)&local_848,&local_738,name_79);
    DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
              (&local_750,(Builder *)&local_848);
    kj::_::Debug::log<char_const(&)[121],char_const(&)[15],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x18a,ERROR,
               "\"failed: expected \" \"(\\\"x structlist 1\\\") == (listReader[0].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", \"x structlist 1\", listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
               ,(char (*) [121])
                "failed: expected (\"x structlist 1\") == (listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
               ,(char (*) [15])"x structlist 1",&local_750);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
    DynamicValue::Builder::~Builder((Builder *)&stack0xfffffffffffff7f8);
  }
  DynamicList::Builder::operator[]((Builder *)&stack0xfffffffffffff7f8,&local_788,1);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&local_738,(Builder *)&stack0xfffffffffffff7f8);
  name_80.content.size_ = 10;
  name_80.content.ptr = "textField";
  DynamicStruct::Builder::get((Builder *)&local_848,&local_738,name_80);
  DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
            (&local_750,(Builder *)&local_848);
  bVar21 = true;
  if (local_750.content.size_ == 0xf) {
    bVar21 = *(long *)((long)local_750.content.ptr + 6) != 0x32207473696c7463 ||
             *(long *)local_750.content.ptr != 0x7463757274732078;
  }
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&stack0xfffffffffffff7f8);
  if ((bool)(bVar21 & kj::_::Debug::minSeverity < 3)) {
    DynamicList::Builder::operator[]((Builder *)&stack0xfffffffffffff7f8,&local_788,1);
    DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              (&local_738,(Builder *)&stack0xfffffffffffff7f8);
    name_81.content.size_ = 10;
    name_81.content.ptr = "textField";
    DynamicStruct::Builder::get((Builder *)&local_848,&local_738,name_81);
    DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
              (&local_750,(Builder *)&local_848);
    kj::_::Debug::log<char_const(&)[121],char_const(&)[15],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x18b,ERROR,
               "\"failed: expected \" \"(\\\"x structlist 2\\\") == (listReader[1].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", \"x structlist 2\", listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
               ,(char (*) [121])
                "failed: expected (\"x structlist 2\") == (listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
               ,(char (*) [15])"x structlist 2",&local_750);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
    DynamicValue::Builder::~Builder((Builder *)&stack0xfffffffffffff7f8);
  }
  DynamicList::Builder::operator[]((Builder *)&stack0xfffffffffffff7f8,&local_788,2);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&local_738,(Builder *)&stack0xfffffffffffff7f8);
  name_82.content.size_ = 10;
  name_82.content.ptr = "textField";
  DynamicStruct::Builder::get((Builder *)&local_848,&local_738,name_82);
  DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
            (&local_750,(Builder *)&local_848);
  bVar21 = true;
  if (local_750.content.size_ == 0xf) {
    bVar21 = *(long *)((long)local_750.content.ptr + 6) != 0x33207473696c7463 ||
             *(long *)local_750.content.ptr != 0x7463757274732078;
  }
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&stack0xfffffffffffff7f8);
  if ((bool)(bVar21 & kj::_::Debug::minSeverity < 3)) {
    DynamicList::Builder::operator[]((Builder *)&stack0xfffffffffffff7f8,&local_788,2);
    DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              (&local_738,(Builder *)&stack0xfffffffffffff7f8);
    name_83.content.size_ = 10;
    name_83.content.ptr = "textField";
    DynamicStruct::Builder::get((Builder *)&local_848,&local_738,name_83);
    DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
              (&local_750,(Builder *)&local_848);
    kj::_::Debug::log<char_const(&)[121],char_const(&)[15],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x18c,ERROR,
               "\"failed: expected \" \"(\\\"x structlist 3\\\") == (listReader[2].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", \"x structlist 3\", listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
               ,(char (*) [121])
                "failed: expected (\"x structlist 3\") == (listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
               ,(char (*) [15])"x structlist 3",&local_750);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
    DynamicValue::Builder::~Builder((Builder *)&stack0xfffffffffffff7f8);
  }
  name_84.content.size_ = 9;
  name_84.content.ptr = "enumList";
  sVar20 = 9;
  DynamicStruct::Builder::get(&local_3f0,&local_7b8,name_84);
  local_838 = "grault";
  local_848.exception = (Exception *)0x2c4035;
  pcStack_840 = (char *)((long)"\"failed: expected \" \"(\\\"foo\\\") == (bar)\", \"foo\", bar" +
                        0x31);
  expected_13._M_len = sVar20;
  expected_13._M_array = (iterator)0x3;
  checkEnumList<capnp::DynamicValue::Builder>
            ((anon_unknown_129 *)&local_3f0,(Builder *)&local_848,expected_13);
  DynamicValue::Builder::~Builder(&local_3f0);
  name_85.content.size_ = 10;
  name_85.content.ptr = "enumField";
  DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_85);
  DynamicValue::Builder::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply((Builder *)&local_848);
  e_01._8_4_ = in_stack_fffffffffffff7f8;
  e_01.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffff7f0;
  e_01._12_4_ = in_stack_fffffffffffff7fc;
  RVar29 = anon_unknown_129::name(e_01);
  if (RVar29.super_StringPtr.content.size_ == 6) {
    iVar3 = *RVar29.super_StringPtr.content.ptr;
    iVar8 = RVar29.super_StringPtr.content.ptr[1];
    DynamicValue::Builder::~Builder((Builder *)&local_848);
    if ((char)iVar8 == 'e' && iVar3 == 0x67726f63) goto LAB_0023e683;
  }
  else {
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  if (kj::_::Debug::minSeverity < 3) {
    name_86.content.size_ = 10;
    name_86.content.ptr = "enumField";
    DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_86);
    DynamicValue::Builder::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply((Builder *)&local_848);
    e_02._8_4_ = in_stack_fffffffffffff7f8;
    e_02.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffff7f0;
    e_02._12_4_ = in_stack_fffffffffffff7fc;
    anon_unknown_129::name(e_02);
    kj::_::Debug::log<char_const(&)[89],char_const(&)[6],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,400,ERROR,
               "\"failed: expected \" \"(\\\"corge\\\") == (name(reader.get(\\\"enumField\\\").template as<DynamicEnum>()))\", \"corge\", name(reader.get(\"enumField\").template as<DynamicEnum>())"
               ,(char (*) [89])
                "failed: expected (\"corge\") == (name(reader.get(\"enumField\").template as<DynamicEnum>()))"
               ,(char (*) [6])"corge",(Reader *)&stack0xfffffffffffff7f8);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
LAB_0023e683:
  name_87.content.size_ = 9;
  name_87.content.ptr = "voidList";
  DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_87);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&stack0xfffffffffffff7f8,(Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  if ((local_800._32_4_ != 6) && (kj::_::Debug::minSeverity < 3)) {
    local_788.schema.elementType.baseType = UINT8;
    local_788.schema.elementType.listDepth = '\0';
    local_788.schema.elementType.isImplicitParam = false;
    name_88.content.size_ = 9;
    name_88.content.ptr = "voidList";
    DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_88);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&stack0xfffffffffffff7f8,(Builder *)&local_848);
    local_7b8.schema.super_Schema.raw._0_4_ = local_800._32_4_;
    kj::_::Debug::log<char_const(&)[84],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x192,ERROR,
               "\"failed: expected \" \"(6u) == (reader.get(\\\"voidList\\\").template as<DynamicList>().size())\", 6u, reader.get(\"voidList\").template as<DynamicList>().size()"
               ,(char (*) [84])
                "failed: expected (6u) == (reader.get(\"voidList\").template as<DynamicList>().size())"
               ,(uint *)&local_788,(uint *)&local_7b8);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  name_89.content.size_ = 9;
  name_89.content.ptr = "boolList";
  sVar20 = 9;
  DynamicStruct::Builder::get(&local_430,(Builder *)&stack0x00000008,name_89);
  local_848.exception._0_4_ = 0x1000001;
  expected_14._M_len = sVar20;
  expected_14._M_array = (iterator)0x4;
  checkList<bool,capnp::DynamicValue::Builder>((_ *)&local_430,(Builder *)&local_848,expected_14);
  DynamicValue::Builder::~Builder(&local_430);
  name_90.content.size_ = 9;
  name_90.content.ptr = "int8List";
  sVar20 = 9;
  DynamicStruct::Builder::get(&local_470,(Builder *)&stack0x00000008,name_90);
  local_848.exception._0_2_ = 0x916f;
  expected_15._M_len = sVar20;
  expected_15._M_array = (iterator)0x2;
  checkList<signed_char,capnp::DynamicValue::Builder>
            ((_ *)&local_470,(Builder *)&local_848,expected_15);
  DynamicValue::Builder::~Builder(&local_470);
  name_91.content.size_ = 10;
  name_91.content.ptr = "int16List";
  sVar20 = 10;
  DynamicStruct::Builder::get(&local_4b0,(Builder *)&stack0x00000008,name_91);
  local_848.exception._0_4_ = 0xd4992b67;
  expected_16._M_len = sVar20;
  expected_16._M_array = (iterator)0x2;
  checkList<short,capnp::DynamicValue::Builder>((_ *)&local_4b0,(Builder *)&local_848,expected_16);
  DynamicValue::Builder::~Builder(&local_4b0);
  name_92.content.size_ = 10;
  name_92.content.ptr = "int32List";
  sVar20 = 10;
  DynamicStruct::Builder::get(&local_4f0,(Builder *)&stack0x00000008,name_92);
  local_848.exception = (Exception *)0xf9609439069f6bc7;
  expected_17._M_len = sVar20;
  expected_17._M_array = (iterator)0x2;
  checkList<int,capnp::DynamicValue::Builder>((_ *)&local_4f0,(Builder *)&local_848,expected_17);
  DynamicValue::Builder::~Builder(&local_4f0);
  name_93.content.size_ = 10;
  name_93.content.ptr = "int64List";
  sVar20 = 10;
  DynamicStruct::Builder::get(&local_530,(Builder *)&stack0x00000008,name_93);
  local_848.exception = (Exception *)0xf6b75ab2bc471c7;
  pcStack_840 = (char *)0xf0948a54d43b8e39;
  expected_18._M_len = sVar20;
  expected_18._M_array = (iterator)0x2;
  checkList<long,capnp::DynamicValue::Builder>((_ *)&local_530,(Builder *)&local_848,expected_18);
  DynamicValue::Builder::~Builder(&local_530);
  name_94.content.size_ = 10;
  name_94.content.ptr = "uInt8List";
  sVar20 = 10;
  DynamicStruct::Builder::get(&local_570,(Builder *)&stack0x00000008,name_94);
  local_848.exception._0_2_ = 0xde6f;
  expected_19._M_len = sVar20;
  expected_19._M_array = (iterator)0x2;
  checkList<unsigned_char,capnp::DynamicValue::Builder>
            ((_ *)&local_570,(Builder *)&local_848,expected_19);
  DynamicValue::Builder::~Builder(&local_570);
  name_95.content.size_ = 0xb;
  name_95.content.ptr = "uInt16List";
  sVar20 = 0xb;
  DynamicStruct::Builder::get(&local_5b0,(Builder *)&stack0x00000008,name_95);
  local_848.exception._0_4_ = 0xad9c8235;
  expected_20._M_len = sVar20;
  expected_20._M_array = (iterator)0x2;
  checkList<unsigned_short,capnp::DynamicValue::Builder>
            ((_ *)&local_5b0,(Builder *)&local_848,expected_20);
  DynamicValue::Builder::~Builder(&local_5b0);
  name_96.content.size_ = 0xb;
  name_96.content.ptr = "uInt32List";
  sVar20 = 0xb;
  DynamicStruct::Builder::get(&local_5f0,(Builder *)&stack0x00000008,name_96);
  local_848.exception._0_4_ = 0xc6aea155;
  expected_21._M_len = sVar20;
  expected_21._M_array = (iterator)0x1;
  checkList<unsigned_int,capnp::DynamicValue::Builder>
            ((_ *)&local_5f0,(Builder *)&local_848,expected_21);
  DynamicValue::Builder::~Builder(&local_5f0);
  name_97.content.size_ = 0xb;
  name_97.content.ptr = "uInt64List";
  sVar20 = 0xb;
  DynamicStruct::Builder::get(&local_630,(Builder *)&stack0x00000008,name_97);
  local_848.exception = (Exception *)0x9a3298afb5ac71c7;
  expected_22._M_len = sVar20;
  expected_22._M_array = (iterator)0x1;
  checkList<unsigned_long,capnp::DynamicValue::Builder>
            ((_ *)&local_630,(Builder *)&local_848,expected_22);
  DynamicValue::Builder::~Builder(&local_630);
  name_98.content.size_ = 0xc;
  name_98.content.ptr = "float32List";
  DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_98);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&stack0xfffffffffffff7f8,(Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  if (local_800._32_4_ != 4) {
    local_788.schema.elementType.baseType = INT32;
    local_788.schema.elementType.listDepth = '\0';
    local_788.schema.elementType.isImplicitParam = false;
    local_7b8.schema.super_Schema.raw._0_4_ = local_800._32_4_;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_848,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x19e,FAILED,"(4u) == (listReader.size())","4u, listReader.size()",
               (uint *)&local_788,(uint *)&local_7b8);
    kj::_::Debug::Fault::fatal(&local_848);
  }
  DynamicList::Builder::operator[]((Builder *)&local_848,(Builder *)&stack0xfffffffffffff7f8,0);
  fVar22 = DynamicValue::Builder::AsImpl<float,_(capnp::Kind)0>::apply((Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  if (((fVar22 != 5555.5) || (NAN(fVar22))) && (kj::_::Debug::minSeverity < 3)) {
    local_788.schema.elementType.baseType = 0x9c00;
    local_788.schema.elementType.listDepth = 0xad;
    local_788.schema.elementType.isImplicitParam = true;
    DynamicList::Builder::operator[]((Builder *)&local_848,(Builder *)&stack0xfffffffffffff7f8,0);
    fVar22 = DynamicValue::Builder::AsImpl<float,_(capnp::Kind)0>::apply((Builder *)&local_848);
    local_7b8.schema.super_Schema.raw._0_4_ = fVar22;
    kj::_::Debug::log<char_const(&)[67],float,float>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x19f,ERROR,
               "\"failed: expected \" \"(5555.5f) == (listReader[0].template as<float>())\", 5555.5f, listReader[0].template as<float>()"
               ,(char (*) [67])"failed: expected (5555.5f) == (listReader[0].template as<float>())",
               (float *)&local_788,(float *)&local_7b8);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  DynamicList::Builder::operator[]((Builder *)&local_848,(Builder *)&stack0xfffffffffffff7f8,1);
  fVar22 = DynamicValue::Builder::AsImpl<float,_(capnp::Kind)0>::apply((Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  if ((fVar22 < INFINITY) && (kj::_::Debug::minSeverity < 3)) {
    local_788.schema.elementType.baseType = VOID;
    local_788.schema.elementType.listDepth = 0x80;
    local_788.schema.elementType.isImplicitParam = true;
    DynamicList::Builder::operator[]((Builder *)&local_848,(Builder *)&stack0xfffffffffffff7f8,1);
    fVar22 = DynamicValue::Builder::AsImpl<float,_(capnp::Kind)0>::apply((Builder *)&local_848);
    local_7b8.schema.super_Schema.raw._0_4_ = fVar22;
    kj::_::Debug::log<char_const(&)[69],float,float>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1a0,ERROR,
               "\"failed: expected \" \"(kj::inf()) == (listReader[1].template as<float>())\", kj::inf(), listReader[1].template as<float>()"
               ,(char (*) [69])
                "failed: expected (kj::inf()) == (listReader[1].template as<float>())",
               (float *)&local_788,(float *)&local_7b8);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  DynamicList::Builder::operator[]((Builder *)&local_848,(Builder *)&stack0xfffffffffffff7f8,2);
  fVar22 = DynamicValue::Builder::AsImpl<float,_(capnp::Kind)0>::apply((Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  if ((-INFINITY < fVar22) && (kj::_::Debug::minSeverity < 3)) {
    local_788.schema.elementType.baseType = VOID;
    local_788.schema.elementType.listDepth = 0x80;
    local_788.schema.elementType.isImplicitParam = true;
    DynamicList::Builder::operator[]((Builder *)&local_848,(Builder *)&stack0xfffffffffffff7f8,2);
    fVar22 = DynamicValue::Builder::AsImpl<float,_(capnp::Kind)0>::apply((Builder *)&local_848);
    local_7b8.schema.super_Schema.raw._0_4_ = fVar22;
    kj::_::Debug::log<char_const(&)[70],float,float>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1a1,ERROR,
               "\"failed: expected \" \"(-kj::inf()) == (listReader[2].template as<float>())\", -kj::inf(), listReader[2].template as<float>()"
               ,(char (*) [70])
                "failed: expected (-kj::inf()) == (listReader[2].template as<float>())",
               (float *)&local_788,(float *)&local_7b8);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  DynamicList::Builder::operator[]((Builder *)&local_848,(Builder *)&stack0xfffffffffffff7f8,3);
  fVar22 = DynamicValue::Builder::AsImpl<float,_(capnp::Kind)0>::apply((Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  if ((!NAN(fVar22)) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[59]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1a2,ERROR,"\"failed: expected \" \"isNaN(listReader[3].template as<float>())\"",
               (char (*) [59])"failed: expected isNaN(listReader[3].template as<float>())");
  }
  name_99.content.size_ = 0xc;
  name_99.content.ptr = "float64List";
  DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_99);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&stack0xfffffffffffff7f8,(Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  DynamicList::Builder::operator[]((Builder *)&local_848,(Builder *)&stack0xfffffffffffff7f8,0);
  dVar4 = DynamicValue::Builder::AsImpl<double,_(capnp::Kind)0>::apply((Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  if (((dVar4 != 7777.75) || (NAN(dVar4))) && (kj::_::Debug::minSeverity < 3)) {
    local_788.schema.elementType._0_8_ = (uchar *)0x40be61c000000000;
    DynamicList::Builder::operator[]((Builder *)&local_848,(Builder *)&stack0xfffffffffffff7f8,0);
    local_7b8.schema.super_Schema.raw =
         (Schema)DynamicValue::Builder::AsImpl<double,_(capnp::Kind)0>::apply((Builder *)&local_848)
    ;
    kj::_::Debug::log<char_const(&)[68],double,double>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1a7,ERROR,
               "\"failed: expected \" \"(7777.75) == (listReader[0].template as<double>())\", 7777.75, listReader[0].template as<double>()"
               ,(char (*) [68])"failed: expected (7777.75) == (listReader[0].template as<double>())"
               ,(double *)&local_788,(double *)&local_7b8);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  DynamicList::Builder::operator[]((Builder *)&local_848,(Builder *)&stack0xfffffffffffff7f8,1);
  dVar4 = DynamicValue::Builder::AsImpl<double,_(capnp::Kind)0>::apply((Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  if ((dVar4 < INFINITY) && (kj::_::Debug::minSeverity < 3)) {
    local_7b8.schema.super_Schema.raw._0_4_ = 0x7f800000;
    DynamicList::Builder::operator[]((Builder *)&local_848,(Builder *)&stack0xfffffffffffff7f8,1);
    puVar17 = (uchar *)DynamicValue::Builder::AsImpl<double,_(capnp::Kind)0>::apply
                                 ((Builder *)&local_848);
    local_788.schema.elementType._0_8_ = puVar17;
    kj::_::Debug::log<char_const(&)[70],float,double>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1a8,ERROR,
               "\"failed: expected \" \"(kj::inf()) == (listReader[1].template as<double>())\", kj::inf(), listReader[1].template as<double>()"
               ,(char (*) [70])
                "failed: expected (kj::inf()) == (listReader[1].template as<double>())",
               (float *)&local_7b8,(double *)&local_788);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  DynamicList::Builder::operator[]((Builder *)&local_848,(Builder *)&stack0xfffffffffffff7f8,2);
  dVar4 = DynamicValue::Builder::AsImpl<double,_(capnp::Kind)0>::apply((Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  if ((-INFINITY < dVar4) && (kj::_::Debug::minSeverity < 3)) {
    local_7b8.schema.super_Schema.raw._0_4_ = 0xff800000;
    DynamicList::Builder::operator[]((Builder *)&local_848,(Builder *)&stack0xfffffffffffff7f8,2);
    puVar17 = (uchar *)DynamicValue::Builder::AsImpl<double,_(capnp::Kind)0>::apply
                                 ((Builder *)&local_848);
    local_788.schema.elementType._0_8_ = puVar17;
    kj::_::Debug::log<char_const(&)[71],float,double>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1a9,ERROR,
               "\"failed: expected \" \"(-kj::inf()) == (listReader[2].template as<double>())\", -kj::inf(), listReader[2].template as<double>()"
               ,(char (*) [71])
                "failed: expected (-kj::inf()) == (listReader[2].template as<double>())",
               (float *)&local_7b8,(double *)&local_788);
    DynamicValue::Builder::~Builder((Builder *)&local_848);
  }
  DynamicList::Builder::operator[]((Builder *)&local_848,(Builder *)&stack0xfffffffffffff7f8,3);
  dVar4 = DynamicValue::Builder::AsImpl<double,_(capnp::Kind)0>::apply((Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  if ((!NAN(dVar4)) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[60]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1aa,ERROR,"\"failed: expected \" \"isNaN(listReader[3].template as<double>())\"",
               (char (*) [60])"failed: expected isNaN(listReader[3].template as<double>())");
  }
  name_x00100.content.size_ = 9;
  name_x00100.content.ptr = "textList";
  DynamicStruct::Builder::get(&local_670,(Builder *)&stack0x00000008,name_x00100);
  local_848.exception = (Exception *)0x2c41f3;
  pcStack_840 = (char *)0x6;
  local_838 = "xyzzy";
  uStack_830 = 6;
  local_828 = "thud";
  uStack_820 = (byte *)0x5;
  expected_23._M_len = (size_type)"xyzzy";
  expected_23._M_array = (iterator)0x3;
  checkList<capnp::Text,capnp::DynamicValue::Builder>
            ((_ *)&local_670,(Builder *)&local_848,expected_23);
  DynamicValue::Builder::~Builder(&local_670);
  name_x00101.content.size_ = 9;
  name_x00101.content.ptr = "dataList";
  sVar20 = 9;
  DynamicStruct::Builder::get(&local_6b0,(Builder *)&stack0x00000008,name_x00101);
  local_848.exception = (Exception *)0x2cc546;
  pcStack_840 = (char *)0x4;
  local_838 = anon_var_dwarf_85a70;
  uStack_830 = 9;
  local_828 = "rfc3092";
  uStack_820 = (byte *)0x7;
  expected_24._M_len = sVar20;
  expected_24._M_array = (iterator)0x3;
  checkList<capnp::Data,capnp::DynamicValue::Builder>
            ((_ *)&local_6b0,(Builder *)&local_848,expected_24);
  DynamicValue::Builder::~Builder(&local_6b0);
  name_x00102.content.size_ = 0xb;
  name_x00102.content.ptr = "structList";
  DynamicStruct::Builder::get((Builder *)&local_848,(Builder *)&stack0x00000008,name_x00102);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            (&local_788,(Builder *)&local_848);
  DynamicValue::Builder::~Builder((Builder *)&local_848);
  if (local_788.builder.elementCount == 3) {
    DynamicList::Builder::operator[]((Builder *)&stack0xfffffffffffff7f8,&local_788,0);
    DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              (&local_7b8,(Builder *)&stack0xfffffffffffff7f8);
    name_x00103.content.size_ = 10;
    name_x00103.content.ptr = "textField";
    DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_x00103);
    DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
              ((BuilderFor<Text> *)&local_738,(Builder *)&local_848);
    bVar21 = true;
    if (local_738.builder.capTable == (CapTableBuilder *)0xd) {
      bVar21 = ((local_738.builder.segment)->super_SegmentReader).id.value != 0x31207473 ||
               ((local_738.builder.segment)->super_SegmentReader).arena !=
               (Arena *)0x696c746375727473;
    }
    DynamicValue::Builder::~Builder((Builder *)&local_848);
    DynamicValue::Builder::~Builder((Builder *)&stack0xfffffffffffff7f8);
    if ((bool)(bVar21 & kj::_::Debug::minSeverity < 3)) {
      DynamicList::Builder::operator[]((Builder *)&stack0xfffffffffffff7f8,&local_788,0);
      DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                (&local_7b8,(Builder *)&stack0xfffffffffffff7f8);
      name_x00104.content.size_ = 10;
      name_x00104.content.ptr = "textField";
      DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_x00104);
      DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                ((BuilderFor<Text> *)&local_738,(Builder *)&local_848);
      kj::_::Debug::log<char_const(&)[119],char_const(&)[13],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1b1,ERROR,
                 "\"failed: expected \" \"(\\\"structlist 1\\\") == (listReader[0].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", \"structlist 1\", listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                 ,(char (*) [119])
                  "failed: expected (\"structlist 1\") == (listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                 ,(char (*) [13])0x2cbf7c,(Builder *)&local_738);
      DynamicValue::Builder::~Builder((Builder *)&local_848);
      DynamicValue::Builder::~Builder((Builder *)&stack0xfffffffffffff7f8);
    }
    DynamicList::Builder::operator[]((Builder *)&stack0xfffffffffffff7f8,&local_788,1);
    DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              (&local_7b8,(Builder *)&stack0xfffffffffffff7f8);
    name_x00105.content.size_ = 10;
    name_x00105.content.ptr = "textField";
    DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_x00105);
    DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
              ((BuilderFor<Text> *)&local_738,(Builder *)&local_848);
    bVar21 = true;
    if (local_738.builder.capTable == (CapTableBuilder *)0xd) {
      bVar21 = ((local_738.builder.segment)->super_SegmentReader).id.value != 0x32207473 ||
               ((local_738.builder.segment)->super_SegmentReader).arena !=
               (Arena *)0x696c746375727473;
    }
    DynamicValue::Builder::~Builder((Builder *)&local_848);
    DynamicValue::Builder::~Builder((Builder *)&stack0xfffffffffffff7f8);
    if ((bool)(bVar21 & kj::_::Debug::minSeverity < 3)) {
      DynamicList::Builder::operator[]((Builder *)&stack0xfffffffffffff7f8,&local_788,1);
      DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                (&local_7b8,(Builder *)&stack0xfffffffffffff7f8);
      name_x00106.content.size_ = 10;
      name_x00106.content.ptr = "textField";
      DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_x00106);
      DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                ((BuilderFor<Text> *)&local_738,(Builder *)&local_848);
      kj::_::Debug::log<char_const(&)[119],char_const(&)[13],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1b2,ERROR,
                 "\"failed: expected \" \"(\\\"structlist 2\\\") == (listReader[1].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", \"structlist 2\", listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                 ,(char (*) [119])
                  "failed: expected (\"structlist 2\") == (listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                 ,(char (*) [13])0x2bdba7,(Builder *)&local_738);
      DynamicValue::Builder::~Builder((Builder *)&local_848);
      DynamicValue::Builder::~Builder((Builder *)&stack0xfffffffffffff7f8);
    }
    DynamicList::Builder::operator[]((Builder *)&stack0xfffffffffffff7f8,&local_788,2);
    DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              (&local_7b8,(Builder *)&stack0xfffffffffffff7f8);
    name_x00107.content.size_ = 10;
    name_x00107.content.ptr = "textField";
    DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_x00107);
    DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
              ((BuilderFor<Text> *)&local_738,(Builder *)&local_848);
    bVar21 = true;
    if (local_738.builder.capTable == (CapTableBuilder *)0xd) {
      bVar21 = ((local_738.builder.segment)->super_SegmentReader).id.value != 0x33207473 ||
               ((local_738.builder.segment)->super_SegmentReader).arena !=
               (Arena *)0x696c746375727473;
    }
    DynamicValue::Builder::~Builder((Builder *)&local_848);
    DynamicValue::Builder::~Builder((Builder *)&stack0xfffffffffffff7f8);
    if ((bool)(bVar21 & kj::_::Debug::minSeverity < 3)) {
      DynamicList::Builder::operator[]((Builder *)&stack0xfffffffffffff7f8,&local_788,2);
      DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                (&local_7b8,(Builder *)&stack0xfffffffffffff7f8);
      name_x00108.content.size_ = 10;
      name_x00108.content.ptr = "textField";
      DynamicStruct::Builder::get((Builder *)&local_848,&local_7b8,name_x00108);
      DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                ((BuilderFor<Text> *)&local_738,(Builder *)&local_848);
      kj::_::Debug::log<char_const(&)[119],char_const(&)[13],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1b3,ERROR,
                 "\"failed: expected \" \"(\\\"structlist 3\\\") == (listReader[2].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", \"structlist 3\", listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                 ,(char (*) [119])
                  "failed: expected (\"structlist 3\") == (listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                 ,(char (*) [13])0x2cc120,(Builder *)&local_738);
      DynamicValue::Builder::~Builder((Builder *)&local_848);
      DynamicValue::Builder::~Builder((Builder *)&stack0xfffffffffffff7f8);
    }
    name_x00109.content.size_ = 9;
    name_x00109.content.ptr = "enumList";
    sVar20 = 9;
    DynamicStruct::Builder::get(&local_6f0,(Builder *)&stack0x00000008,name_x00109);
    local_848.exception = (Exception *)0x2b7152;
    pcStack_840 = "garply";
    expected_25._M_len = sVar20;
    expected_25._M_array = (iterator)0x2;
    checkEnumList<capnp::DynamicValue::Builder>
              ((anon_unknown_129 *)&local_6f0,(Builder *)&local_848,expected_25);
    DynamicValue::Builder::~Builder(&local_6f0);
    return;
  }
  local_7b8.schema.super_Schema.raw._0_4_ = local_788.builder.elementCount;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
            (&local_848,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
             ,0x1b0,FAILED,"(3u) == (listReader.size())","3u, listReader.size()",
             (uint *)&stack0xfffffffffffff7f8,(uint *)&local_7b8);
  kj::_::Debug::Fault::fatal(&local_848);
}

Assistant:

void dynamicCheckTestMessage(Reader reader) {
  EXPECT_EQ(VOID, reader.get("voidField").as<Void>());
  EXPECT_EQ(true, reader.get("boolField").as<bool>());
  EXPECT_EQ(-123, reader.get("int8Field").as<int8_t>());
  EXPECT_EQ(-12345, reader.get("int16Field").as<int16_t>());
  EXPECT_EQ(-12345678, reader.get("int32Field").as<int32_t>());
  EXPECT_EQ(-123456789012345ll, reader.get("int64Field").as<int64_t>());
  EXPECT_EQ(234u, reader.get("uInt8Field").as<uint8_t>());
  EXPECT_EQ(45678u, reader.get("uInt16Field").as<uint16_t>());
  EXPECT_EQ(3456789012u, reader.get("uInt32Field").as<uint32_t>());
  EXPECT_EQ(12345678901234567890ull, reader.get("uInt64Field").as<uint64_t>());
  EXPECT_FLOAT_EQ(1234.5f, reader.get("float32Field").as<float>());
  EXPECT_DOUBLE_EQ(-123e45, reader.get("float64Field").as<double>());
  EXPECT_EQ("foo", reader.get("textField").as<Text>());
  EXPECT_EQ(data("bar"), reader.get("dataField").as<Data>());
  {
    auto subReader = reader.get("structField").as<DynamicStruct>();
    EXPECT_EQ(VOID, subReader.get("voidField").as<Void>());
    EXPECT_EQ(true, subReader.get("boolField").as<bool>());
    EXPECT_EQ(-12, subReader.get("int8Field").as<int8_t>());
    EXPECT_EQ(3456, subReader.get("int16Field").as<int16_t>());
    EXPECT_EQ(-78901234, subReader.get("int32Field").as<int32_t>());
    EXPECT_EQ(56789012345678ll, subReader.get("int64Field").as<int64_t>());
    EXPECT_EQ(90u, subReader.get("uInt8Field").as<uint8_t>());
    EXPECT_EQ(1234u, subReader.get("uInt16Field").as<uint16_t>());
    EXPECT_EQ(56789012u, subReader.get("uInt32Field").as<uint32_t>());
    EXPECT_EQ(345678901234567890ull, subReader.get("uInt64Field").as<uint64_t>());
    EXPECT_FLOAT_EQ(-1.25e-10f, subReader.get("float32Field").as<float>());
    EXPECT_DOUBLE_EQ(345, subReader.get("float64Field").as<double>());
    EXPECT_EQ("baz", subReader.get("textField").as<Text>());
    EXPECT_EQ(data("qux"), subReader.get("dataField").as<Data>());
    {
      auto subSubReader = subReader.get("structField").as<DynamicStruct>();
      EXPECT_EQ("nested", subSubReader.get("textField").as<Text>());
      EXPECT_EQ("really nested", subSubReader.get("structField").as<DynamicStruct>()
                                             .get("textField").as<Text>());
    }
    EXPECT_EQ("baz", name(subReader.get("enumField").as<DynamicEnum>()));

    checkList<Void>(subReader.get("voidList"), {VOID, VOID, VOID});
    checkList<bool>(subReader.get("boolList"), {false, true, false, true, true});
    checkList<int8_t>(subReader.get("int8List"), {12, -34, -0x80, 0x7f});
    checkList<int16_t>(subReader.get("int16List"), {1234, -5678, -0x8000, 0x7fff});
    // gcc warns on -0x800... and the only work-around I could find was to do -0x7ff...-1.
    checkList<int32_t>(subReader.get("int32List"), {12345678, -90123456, -0x7fffffff-1, 0x7fffffff});
    checkList<int64_t>(subReader.get("int64List"), {123456789012345ll, -678901234567890ll, -0x7fffffffffffffffll-1, 0x7fffffffffffffffll});
    checkList<uint8_t>(subReader.get("uInt8List"), {12u, 34u, 0u, 0xffu});
    checkList<uint16_t>(subReader.get("uInt16List"), {1234u, 5678u, 0u, 0xffffu});
    checkList<uint32_t>(subReader.get("uInt32List"), {12345678u, 90123456u, 0u, 0xffffffffu});
    checkList<uint64_t>(subReader.get("uInt64List"), {123456789012345ull, 678901234567890ull, 0ull, 0xffffffffffffffffull});
    checkList<float>(subReader.get("float32List"), {0.0f, 1234567.0f, 1e37f, -1e37f, 1e-37f, -1e-37f});
    checkList<double>(subReader.get("float64List"), {0.0, 123456789012345.0, 1e306, -1e306, 1e-306, -1e-306});
    checkList<Text>(subReader.get("textList"), {"quux", "corge", "grault"});
    checkList<Data>(subReader.get("dataList"), {data("garply"), data("waldo"), data("fred")});
    {
      auto listReader = subReader.get("structList").as<DynamicList>();
      ASSERT_EQ(3u, listReader.size());
      EXPECT_EQ("x structlist 1", listReader[0].as<DynamicStruct>().get("textField").as<Text>());
      EXPECT_EQ("x structlist 2", listReader[1].as<DynamicStruct>().get("textField").as<Text>());
      EXPECT_EQ("x structlist 3", listReader[2].as<DynamicStruct>().get("textField").as<Text>());
    }
    checkEnumList(subReader.get("enumList"), {"qux", "bar", "grault"});
  }
  EXPECT_EQ("corge", name(reader.get("enumField").as<DynamicEnum>()));

  EXPECT_EQ(6u, reader.get("voidList").as<DynamicList>().size());
  checkList<bool>(reader.get("boolList"), {true, false, false, true});
  checkList<int8_t>(reader.get("int8List"), {111, -111});
  checkList<int16_t>(reader.get("int16List"), {11111, -11111});
  checkList<int32_t>(reader.get("int32List"), {111111111, -111111111});
  checkList<int64_t>(reader.get("int64List"), {1111111111111111111ll, -1111111111111111111ll});
  checkList<uint8_t>(reader.get("uInt8List"), {111u, 222u});
  checkList<uint16_t>(reader.get("uInt16List"), {33333u, 44444u});
  checkList<uint32_t>(reader.get("uInt32List"), {3333333333u});
  checkList<uint64_t>(reader.get("uInt64List"), {11111111111111111111ull});
  {
    auto listReader = reader.get("float32List").as<DynamicList>();
    ASSERT_EQ(4u, listReader.size());
    EXPECT_EQ(5555.5f, listReader[0].as<float>());
    EXPECT_EQ(kj::inf(), listReader[1].as<float>());
    EXPECT_EQ(-kj::inf(), listReader[2].as<float>());
    EXPECT_TRUE(isNaN(listReader[3].as<float>()));
  }
  {
    auto listReader = reader.get("float64List").as<DynamicList>();
    ASSERT_EQ(4u, listReader.size());
    EXPECT_EQ(7777.75, listReader[0].as<double>());
    EXPECT_EQ(kj::inf(), listReader[1].as<double>());
    EXPECT_EQ(-kj::inf(), listReader[2].as<double>());
    EXPECT_TRUE(isNaN(listReader[3].as<double>()));
  }
  checkList<Text>(reader.get("textList"), {"plugh", "xyzzy", "thud"});
  checkList<Data>(reader.get("dataList"), {data("oops"), data("exhausted"), data("rfc3092")});
  {
    auto listReader = reader.get("structList").as<DynamicList>();
    ASSERT_EQ(3u, listReader.size());
    EXPECT_EQ("structlist 1", listReader[0].as<DynamicStruct>().get("textField").as<Text>());
    EXPECT_EQ("structlist 2", listReader[1].as<DynamicStruct>().get("textField").as<Text>());
    EXPECT_EQ("structlist 3", listReader[2].as<DynamicStruct>().get("textField").as<Text>());
  }
  checkEnumList(reader.get("enumList"), {"foo", "garply"});
}